

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

void INT_REVenable_auto_stone(CMConnection conn,EVstone stone_num,int period_sec,int period_usec)

{
  int condition;
  CMFormat format;
  int local_40;
  EVstone local_3c;
  int local_38;
  int local_34;
  
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVenable_auto_stone_req_formats);
  local_40 = condition;
  local_3c = stone_num;
  local_38 = period_sec;
  local_34 = period_usec;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVenable_auto_stone_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,(void *)0x0);
  INT_CMwrite(conn,format,&local_40);
  INT_CMCondition_wait(conn->cm,condition);
  return;
}

Assistant:

extern void
INT_REVenable_auto_stone(CMConnection conn, EVstone stone_num, int period_sec, int period_usec)
{
    int cond;
    CMFormat f;
    EVenable_auto_stone_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVenable_auto_stone_req_formats);
    request.stone_num = stone_num;
    request.period_sec = period_sec;
    request.period_usec = period_usec;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVenable_auto_stone_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, NULL);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
}